

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

bool __thiscall SoftHSM::RFC5652Unpad(SoftHSM *this,ByteString *padded,size_t blocksize)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  ulong in_RDX;
  size_t i;
  uchar padbyte;
  size_t wrappedlen;
  size_t in_stack_ffffffffffffffb8;
  ByteString *in_stack_ffffffffffffffc0;
  ulong local_38;
  bool local_1;
  
  sVar2 = ByteString::size((ByteString *)0x18700d);
  if (sVar2 % in_RDX == 0) {
    pbVar3 = ByteString::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    bVar1 = *pbVar3;
    if ((bVar1 == 0) || (in_RDX < bVar1)) {
      softHSMLog(7,"RFC5652Unpad",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1852,"invalid padbyte value %d, larger than blocksize %d",(ulong)bVar1,in_RDX);
      local_1 = false;
    }
    else {
      for (local_38 = sVar2 - bVar1; local_38 < sVar2; local_38 = local_38 + 1) {
        pbVar3 = ByteString::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (*pbVar3 != bVar1) {
          pbVar3 = ByteString::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          softHSMLog(7,"RFC5652Unpad",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x185a,"invalid padding byte %d at position %d",(ulong)*pbVar3,local_38);
          return false;
        }
      }
      ByteString::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_1 = true;
    }
  }
  else {
    softHSMLog(7,"RFC5652Unpad",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x184a,"padded buffer length %d is not a multiple of %d",sVar2,in_RDX);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SoftHSM::RFC5652Unpad(ByteString &padded, size_t blocksize)
{
	auto wrappedlen = padded.size();

	if( wrappedlen % blocksize != 0)
	{
		DEBUG_MSG("padded buffer length %d is not a multiple of %d", wrappedlen, blocksize);
		return false;
	}

	auto padbyte = padded[wrappedlen-1];

	if( padbyte == 0 || padbyte > blocksize )
	{
		DEBUG_MSG("invalid padbyte value %d, larger than blocksize %d", padbyte, blocksize);
		return false;
	}

	for(auto i = wrappedlen-padbyte; i<wrappedlen; i++)
	{
		if( padded[i] != padbyte )
		{
			DEBUG_MSG("invalid padding byte %d at position %d", padded[i], i);
			return false;
		}
	}

	padded.resize(wrappedlen - padbyte); // forget padding
	return true;
}